

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

void __thiscall booster::locale::impl_posix::collator<wchar_t>::~collator(collator<wchar_t> *this)

{
  collator<wchar_t> *in_RDI;
  
  ~collator(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual int do_compare(char_type const *lb,char_type const *le,char_type const *rb,char_type const *re) const
    {
        string_type left(lb,le-lb);
        string_type right(rb,re-rb);
        int res = coll_traits<char_type>::coll(left.c_str(),right.c_str(),*lc_);
        if(res < 0)
            return -1;
        if(res > 0)
            return 1;
        return 0;
    }